

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O2

void read_compare(roaring_bitmap_t *r,uint32_t *ref_values,uint32_t ref_count,uint32_t step)

{
  uint32_t uVar1;
  roaring_uint32_iterator_t *it;
  uint32_t *buf;
  ulong uVar2;
  uint32_t i;
  uint count;
  ulong uVar3;
  
  it = roaring_iterator_create(r);
  uVar2 = 0x10000;
  if (step != 0xffffffff) {
    uVar2 = (ulong)step;
  }
  buf = (uint32_t *)malloc(uVar2 << 2);
  while( true ) {
    if (ref_count == 0) break;
    _assert_true((ulong)it->has_value,"iter->has_value == true",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                 ,0xf68);
    _assert_true((ulong)(it->current_value == *ref_values),"iter->current_value == ref_values[0]",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                 ,0xf69);
    uVar2 = (ulong)step;
    if (step == 0xffffffff) {
      for (uVar3 = 0;
          (uVar2 = (ulong)ref_count, ref_count != uVar3 &&
          (uVar2 = uVar3, (ref_values[uVar3] ^ *ref_values) < 0x10000)); uVar3 = uVar3 + 1) {
      }
    }
    count = (uint)uVar2;
    uVar1 = roaring_uint32_iterator_read(it,buf,count);
    if (ref_count <= count) {
      count = ref_count;
    }
    _assert_true((ulong)(uVar1 == count),"num_got == minimum_uint32(num_ask, ref_count)",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                 ,0xf78);
    for (uVar2 = 0; uVar1 != uVar2; uVar2 = uVar2 + 1) {
      _assert_true((ulong)(ref_values[uVar2] == buf[uVar2]),"ref_values[i] == buffer[i]",
                   "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                   ,0xf7a);
    }
    ref_values = ref_values + uVar1;
    ref_count = ref_count - uVar1;
  }
  _assert_true((ulong)(it->has_value ^ 1),"iter->has_value == false",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0xf80);
  _assert_true((ulong)(it->current_value == 0xffffffff),"iter->current_value == UINT32_MAX",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0xf81);
  uVar1 = roaring_uint32_iterator_read(it,buf,step);
  _assert_true((ulong)(uVar1 == 0),"roaring_uint32_iterator_read(iter, buffer, step) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0xf83);
  _assert_true((ulong)it->has_value ^ 1,"iter->has_value == false",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0xf84);
  _assert_true((ulong)(it->current_value == 0xffffffff),"iter->current_value == UINT32_MAX",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0xf85);
  free(buf);
  roaring_uint32_iterator_free(it);
  return;
}

Assistant:

void read_compare(roaring_bitmap_t *r, const uint32_t *ref_values,
                  uint32_t ref_count, uint32_t step) {
    roaring_uint32_iterator_t *iter = roaring_iterator_create(r);
    uint32_t *buffer = (uint32_t *)malloc(sizeof(uint32_t) *
                                          (step == UINT32_MAX ? 65536 : step));
    while (ref_count > 0) {
        assert_true(iter->has_value == true);
        assert_true(iter->current_value == ref_values[0]);

        uint32_t num_ask = step;
        if (step == UINT32_MAX) {
            num_ask = 0;
            for (uint32_t i = 0; i < ref_count; i++) {
                if ((ref_values[i] >> 16) == (ref_values[0] >> 16)) {
                    num_ask++;
                } else {
                    break;
                }
            }
        }

        uint32_t num_got = roaring_uint32_iterator_read(iter, buffer, num_ask);
        assert_true(num_got == minimum_uint32(num_ask, ref_count));
        for (uint32_t i = 0; i < num_got; i++) {
            assert_true(ref_values[i] == buffer[i]);
        }
        ref_values += num_got;
        ref_count -= num_got;
    }

    assert_true(iter->has_value == false);
    assert_true(iter->current_value == UINT32_MAX);

    assert_true(roaring_uint32_iterator_read(iter, buffer, step) == 0);
    assert_true(iter->has_value == false);
    assert_true(iter->current_value == UINT32_MAX);

    free(buffer);
    roaring_uint32_iterator_free(iter);
}